

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void anon_unknown.dwarf_15e9b71::handleSystemIncludesDep
               (cmLocalGenerator *lg,cmGeneratorTarget *depTgt,string *config,
               cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result,bool excludeImported,string *language)

{
  bool bVar1;
  cmValue cVar2;
  string_view arg;
  string_view arg_00;
  allocator<char> local_a9;
  string local_a8;
  cmGeneratorTarget *local_88;
  cmGeneratorExpressionDAGChecker *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  string local_70;
  string local_50;
  
  local_88 = headTarget;
  local_80 = dagChecker;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_a9);
  cVar2 = cmGeneratorTarget::GetProperty(depTgt,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (cVar2.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_50,(string *)cVar2.Value);
    cmGeneratorExpression::Evaluate(&local_a8,&local_50,lg,config,local_88,local_80,depTgt,language)
    ;
    arg._M_str = local_a8._M_dataplus._M_p;
    arg._M_len = local_a8._M_string_length;
    cmExpandList(arg,result,false);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"SYSTEM",&local_a9);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(depTgt,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (!bVar1) {
    return;
  }
  bVar1 = cmGeneratorTarget::IsImported(depTgt);
  if (bVar1) {
    if (excludeImported) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"IMPORTED_NO_SYSTEM",&local_a9);
    bVar1 = cmGeneratorTarget::GetPropertyAsBool(depTgt,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar1) {
      return;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"INTERFACE_INCLUDE_DIRECTORIES",&local_a9);
  cVar2 = cmGeneratorTarget::GetProperty(depTgt,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (cVar2.Value != (string *)0x0) {
    local_78 = result;
    std::__cxx11::string::string((string *)&local_70,(string *)cVar2.Value);
    cmGeneratorExpression::Evaluate(&local_a8,&local_70,lg,config,local_88,local_80,depTgt,language)
    ;
    arg_00._M_str = local_a8._M_dataplus._M_p;
    arg_00._M_len = local_a8._M_string_length;
    cmExpandList(arg_00,local_78,false);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void handleSystemIncludesDep(cmLocalGenerator* lg,
                             cmGeneratorTarget const* depTgt,
                             const std::string& config,
                             cmGeneratorTarget const* headTarget,
                             cmGeneratorExpressionDAGChecker* dagChecker,
                             std::vector<std::string>& result,
                             bool excludeImported, std::string const& language)
{
  if (cmValue dirs =
        depTgt->GetProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(*dirs, lg, config, headTarget,
                                                 dagChecker, depTgt, language),
                 result);
  }
  if (!depTgt->GetPropertyAsBool("SYSTEM")) {
    return;
  }
  if (depTgt->IsImported()) {
    if (excludeImported) {
      return;
    }
    if (depTgt->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
      return;
    }
  }

  if (cmValue dirs = depTgt->GetProperty("INTERFACE_INCLUDE_DIRECTORIES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(*dirs, lg, config, headTarget,
                                                 dagChecker, depTgt, language),
                 result);
  }
}